

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data-pool.c
# Opt level: O2

MMDB_entry_data_list_s * data_pool_alloc(MMDB_data_pool_s *pool)

{
  ulong uVar1;
  ulong uVar2;
  size_t sVar3;
  size_t __nmemb;
  MMDB_entry_data_list_s *pMVar4;
  size_t sStack_30;
  
  if (pool == (MMDB_data_pool_s *)0x0) {
    return (MMDB_entry_data_list_s *)0x0;
  }
  uVar1 = pool->size;
  uVar2 = pool->used;
  if (uVar2 < uVar1) {
    pMVar4 = pool->block + uVar2;
    sStack_30 = uVar2 + 1;
LAB_00103940:
    pool->used = sStack_30;
  }
  else {
    sVar3 = pool->index;
    if ((0 < (long)uVar1 && sVar3 + 1 != 0x20) && (uVar1 >> 0x39 == 0)) {
      __nmemb = uVar1 * 2;
      pMVar4 = (MMDB_entry_data_list_s *)calloc(__nmemb,0x40);
      pool->blocks[sVar3 + 1] = pMVar4;
      if (pMVar4 != (MMDB_entry_data_list_s *)0x0) {
        pMVar4->pool = pool;
        pool->index = sVar3 + 1;
        pool->block = pMVar4;
        pool->size = __nmemb;
        pool->sizes[sVar3 + 1] = __nmemb;
        sStack_30 = 1;
        goto LAB_00103940;
      }
    }
    pMVar4 = (MMDB_entry_data_list_s *)0x0;
  }
  return pMVar4;
}

Assistant:

MMDB_entry_data_list_s *data_pool_alloc(MMDB_data_pool_s *const pool) {
    if (!pool) {
        return NULL;
    }

    if (pool->used < pool->size) {
        MMDB_entry_data_list_s *const element = pool->block + pool->used;
        pool->used++;
        return element;
    }

    // Take it from a new block of memory.

    size_t const new_index = pool->index + 1;
    if (new_index == DATA_POOL_NUM_BLOCKS) {
        // See the comment about not growing this on DATA_POOL_NUM_BLOCKS.
        return NULL;
    }

    if (!can_multiply(SIZE_MAX, pool->size, 2)) {
        return NULL;
    }
    size_t const new_size = pool->size * 2;

    if (!can_multiply(SIZE_MAX, new_size, sizeof(MMDB_entry_data_list_s))) {
        return NULL;
    }
    pool->blocks[new_index] = calloc(new_size, sizeof(MMDB_entry_data_list_s));
    if (!pool->blocks[new_index]) {
        return NULL;
    }

    // We don't need to set this, but it's useful for introspection in tests.
    pool->blocks[new_index]->pool = pool;

    pool->index = new_index;
    pool->block = pool->blocks[pool->index];

    pool->size = new_size;
    pool->sizes[pool->index] = pool->size;

    MMDB_entry_data_list_s *const element = pool->block;
    pool->used = 1;
    return element;
}